

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall fasttext::Dictionary::initNgrams(Dictionary *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer peVar1;
  pointer piVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string word;
  
  lVar5 = 0x30;
  for (uVar4 = 0; uVar4 < (ulong)(long)this->size_; uVar4 = uVar4 + 1) {
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   BOW_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)(this->words_).
                          super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar5 + -0x30));
    std::operator+(&word,&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   EOW_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    peVar1 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this_00 = (vector<int,_std::allocator<int>_> *)((long)&(peVar1->word)._M_dataplus._M_p + lVar5);
    piVar2 = *(pointer *)((long)&(peVar1->word)._M_dataplus._M_p + lVar5);
    if (*(pointer *)((long)&(peVar1->word)._M_string_length + lVar5) != piVar2) {
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = piVar2;
    }
    local_70._M_dataplus._M_p._0_4_ = (undefined4)uVar4;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_70);
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)(this->words_).
                                   super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x30),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            EOS_abi_cxx11_);
    if (bVar3) {
      computeSubwords(this,&word,
                      (vector<int,_std::allocator<int>_> *)
                      ((long)&(((this->words_).
                                super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                ._M_impl.super__Vector_impl_data._M_start)->word)._M_dataplus._M_p +
                      lVar5),(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)0x0);
    }
    std::__cxx11::string::~string((string *)&word);
    lVar5 = lVar5 + 0x48;
  }
  return;
}

Assistant:

void Dictionary::initNgrams() {
  for (size_t i = 0; i < size_; i++) {
    std::string word = BOW + words_[i].word + EOW;
    words_[i].subwords.clear();
    words_[i].subwords.push_back(i);
    if (words_[i].word != EOS) {
      computeSubwords(word, words_[i].subwords);
    }
  }
}